

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result
btree_init_and_load(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
                   uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta,
                   uint64_t num_keys,btree_load_get_next_kv *next_kv,
                   btree_load_write_done *write_done,void *aux)

{
  bnode_flag_t flag_00;
  idx_t iVar1;
  _func_voidref_void_ptr_bid_t_ptr *p_Var2;
  ulong uVar3;
  _func_void_bnode_ptr_idx_t_void_ptr_void_ptr *p_Var4;
  void *pvVar5;
  bid_t bVar6;
  ushort uVar7;
  btree_result bVar8;
  ulong uVar9;
  bnode *pbVar10;
  btree_kv_ops *pbVar11;
  voidref addr;
  size_t sVar12;
  ulong uVar13;
  void **ppvVar14;
  void *pvVar15;
  void *pvVar16;
  long lVar17;
  void *node_addr;
  size_t sVar18;
  size_t __n;
  bool bVar19;
  ulong uStack_70;
  uint64_t local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  void *local_48;
  void **local_40;
  void *val_to_insert;
  void *key_to_insert;
  
  btree->root_flag = flag | 1;
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->height = 1;
  btree->blksize = nodesize;
  btree->ksize = ksize;
  btree->vsize = vsize;
  if (meta == (btree_meta *)0x0) {
    lVar17 = 0x11;
  }
  else {
    btree->root_flag = flag | 3;
    lVar17 = (ulong)(meta->size + 0x11 & 0xfffffff0) + 0x11;
  }
  if (nodesize < (uint)lVar17) {
    bVar8 = BTREE_RESULT_FAIL;
  }
  else {
    local_48 = (void *)(ulong)ksize;
    uVar13 = (ulong)vsize + (long)local_48;
    local_58 = (nodesize - 0x11) / uVar13;
    uVar9 = local_58;
    if (meta != (btree_meta *)0x0) {
      uVar9 = (((ulong)nodesize - (ulong)(meta->size + 0x11 & 0xfffffff0)) - 0x11) / uVar13;
    }
    if (uVar9 < num_keys) {
      uVar13 = 1;
      uStack_70 = 8;
      __n = 8;
      do {
        sVar18 = __n;
        uVar9 = uVar9 * local_58;
        uVar13 = uVar13 + 1;
        __n = sVar18 + 8;
      } while (uVar9 < num_keys);
      uVar9 = sVar18 + 0x17 & 0xfffffffffffffff0;
      lVar17 = -uVar9;
      pvVar16 = (void *)(((long)&local_68 + lVar17) - uVar9);
      *(undefined8 *)((long)pvVar16 + -8) = 0x10a1f6;
      memset((void *)((long)&local_68 + lVar17),0,__n);
      local_50 = pvVar16;
      *(undefined8 *)((long)pvVar16 + -8) = 0x10a207;
      memset(pvVar16,0,__n);
      pvVar16 = (void *)((long)pvVar16 - (ulong)((int)local_48 + 0xfU & 0xfffffff0));
      local_48 = pvVar16;
      local_60 = uVar13;
      for (local_68 = 0; uVar9 = local_60, local_68 != num_keys; local_68 = local_68 + 1) {
        *(undefined8 *)((long)pvVar16 + -8) = 1;
        uVar13 = *(ulong *)((long)pvVar16 + -8);
        while (bVar19 = uVar9 != 0, uVar9 = uVar9 - 1, bVar19) {
          pbVar10 = *(bnode **)((long)&uStack_70 + uVar13 * 8 + lVar17);
          if (pbVar10 == (bnode *)0x0) {
            val_to_insert = (void *)0x0;
            pvVar15 = btree->blk_handle;
            p_Var2 = btree->blk_ops->blk_alloc;
            *(undefined8 *)((long)pvVar16 + -8) = 0x10a260;
            pbVar10 = (bnode *)(*p_Var2)(pvVar15,(bid_t *)&val_to_insert);
            pvVar15 = val_to_insert;
            if (uVar13 < local_60) {
              uVar7._0_1_ = btree->ksize;
              uVar7._1_1_ = btree->vsize;
              pbVar10->kvsize = uVar7 << 8 | uVar7 >> 8;
              pbVar10->nentry = 0;
              pbVar10->level = (uint16_t)uVar13;
              pbVar10->flag = 0;
              (pbVar10->field_4).data = pbVar10 + 1;
            }
            else {
              flag_00 = btree->root_flag;
              *(undefined8 *)((long)pvVar16 + -8) = 0x10a2b1;
              pbVar10 = _btree_init_node(btree,(bid_t)pvVar15,pbVar10,flag_00,(uint16_t)uVar13,meta)
              ;
              btree->root_bid = (bid_t)val_to_insert;
            }
            *(bnode **)((long)&uStack_70 + uVar13 * 8 + lVar17) = pbVar10;
            *(void **)((long)local_50 + uVar13 * 8 + -8) = val_to_insert;
          }
          if (uVar13 == 1) {
            val_to_insert = (void *)0x0;
            local_40 = (void **)0x0;
            *(undefined8 *)((long)pvVar16 + -8) = 0x10a2e9;
            (*next_kv)(&val_to_insert,&local_40,aux);
            pbVar11 = btree->kv_ops;
            iVar1 = pbVar10->nentry;
            ppvVar14 = local_40;
            pvVar15 = val_to_insert;
          }
          else {
            uVar3 = *(ulong *)((long)local_50 + uVar13 * 8 + -0x10);
            val_to_insert =
                 (void *)(uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                          (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                          (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                          (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38);
            pbVar11 = btree->kv_ops;
            iVar1 = pbVar10->nentry;
            ppvVar14 = &val_to_insert;
            pvVar15 = local_48;
          }
          p_Var4 = pbVar11->set_kv;
          *(undefined8 *)((long)pvVar16 + -8) = 0x10a326;
          (*p_Var4)(pbVar10,iVar1,pvVar15,ppvVar14);
          pvVar5 = local_48;
          pvVar15 = local_50;
          pbVar10 = *(bnode **)((long)&uStack_70 + uVar13 * 8 + lVar17);
          iVar1 = pbVar10->nentry;
          uVar7 = iVar1 + 1;
          pbVar10->nentry = uVar7;
          if (iVar1 != 0) {
            if ((uint)local_58 <= uVar7) {
              pvVar5 = btree->blk_handle;
              bVar6 = *(bid_t *)((long)local_50 + uVar13 * 8 + -8);
              *(undefined8 *)((long)pvVar16 + -8) = 0x10a36e;
              (*write_done)(pvVar5,bVar6,aux);
              *(undefined8 *)((long)&uStack_70 + uVar13 * 8 + lVar17) = 0;
              *(undefined8 *)((long)pvVar15 + uVar13 * 8 + -8) = 0;
            }
            break;
          }
          p_Var4 = btree->kv_ops->get_kv;
          *(undefined8 *)((long)pvVar16 + -8) = 0x10a34a;
          (*p_Var4)(pbVar10,0,pvVar5,(void *)0x0);
          uVar13 = uVar13 + 1;
        }
      }
    }
    else {
      if ((blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
         (blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0)) {
        uStack_70 = 0x10a3e9;
        addr = (*blk_ops->blk_alloc)(blk_handle,&btree->root_bid);
      }
      else {
        uVar9 = lVar17 + uVar13 * num_keys;
        uStack_70 = 0x10a3ae;
        addr = (*blk_ops->blk_alloc_sub)(blk_handle,&btree->root_bid);
        uStack_70 = 0x10a3c0;
        sVar12 = (*btree->blk_ops->blk_get_size)(btree->blk_handle,btree->root_bid);
        if (sVar12 < uVar9) {
          uStack_70 = 0x10a3da;
          addr = (*btree->blk_ops->blk_enlarge_node)
                           (btree->blk_handle,btree->root_bid,uVar9,&btree->root_bid);
        }
      }
      uStack_70 = 0x10a406;
      pbVar10 = _btree_init_node(btree,btree->root_bid,addr,btree->root_flag,1,meta);
      while (bVar19 = num_keys != 0, num_keys = num_keys - 1, bVar19) {
        val_to_insert = (void *)0x0;
        local_40 = (void **)0x0;
        uStack_70 = 0x10a432;
        (*next_kv)(&val_to_insert,&local_40,aux);
        uStack_70 = 0x10a449;
        (*btree->kv_ops->set_kv)(pbVar10,pbVar10->nentry,val_to_insert,local_40);
        pbVar10->nentry = pbVar10->nentry + 1;
      }
    }
    bVar8 = BTREE_RESULT_SUCCESS;
  }
  return bVar8;
}

Assistant:

btree_result btree_init_and_load(
        struct btree *btree,
        void *blk_handle,
        struct btree_blk_ops *blk_ops,
        struct btree_kv_ops *kv_ops,
        uint32_t nodesize,
        uint8_t ksize,
        uint8_t vsize,
        bnode_flag_t flag,
        struct btree_meta *meta,
        uint64_t num_keys,
        btree_load_get_next_kv* next_kv,
        btree_load_write_done* write_done,
        void* aux)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // Calculate max # key-values per node.
    size_t max_num_entries_non_root =
        (nodesize - sizeof(struct bnode) - BLK_MARKER_SIZE) / (ksize + vsize);
    size_t max_num_entries_root =
        meta
        ? ( nodesize - sizeof(struct bnode) - _metasize_align(meta->size) -
            sizeof(metasize_t) - BLK_MARKER_SIZE ) / (ksize + vsize)
        : max_num_entries_non_root;

    if (num_keys <= max_num_entries_root) {
        // Single height tree.
        size_t required_size = min_nodesize + num_keys * (ksize + vsize);
        if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
            addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);

            size_t subblock_size =
                btree->blk_ops->blk_get_size(btree->blk_handle,
                                             btree->root_bid);
            if (subblock_size < required_size) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        required_size,
                                                        &btree->root_bid);
            }
        } else {
            addr = btree->blk_ops->blk_alloc(btree->blk_handle, &btree->root_bid);
        }
        struct bnode* root_node =
            _btree_init_node( btree, btree->root_bid, addr,
                              btree->root_flag, 1, meta );

        // Put entries.
        for (uint64_t ii = 0; ii < num_keys; ++ii) {
            void* key_to_insert = nullptr;
            void* val_to_insert = nullptr;
            next_kv(&key_to_insert, &val_to_insert, aux);
            btree->kv_ops->set_kv( root_node, root_node->nentry,
                                   key_to_insert, val_to_insert );
            root_node->nentry++;
        }
        return BTREE_RESULT_SUCCESS;

    }

    // Otherwise: height >= 2, calculate the tree height.
    size_t exp_height = 2;
    uint64_t max_accomm_entries = max_num_entries_root * max_num_entries_non_root;
    while (max_accomm_entries < num_keys) {
        exp_height++;
        max_accomm_entries *= max_num_entries_non_root;
    }

    struct bnode** cur_node = alca(struct bnode*, exp_height);
    bid_t* node_bids = alca(bid_t, exp_height);
    memset(cur_node, 0x0, sizeof(struct bnode*) * exp_height);
    memset(node_bids, 0x0, sizeof(bid_t) * exp_height);

    uint8_t *k_in_child = alca(uint8_t, btree->ksize);

    for (uint64_t ii = 0; ii < num_keys; ++ii) {
        for (size_t jj = 0; jj < exp_height; ++jj) {
            if (!cur_node[jj]) {
                bid_t new_bid = 0;
                void* new_addr = btree->blk_ops->blk_alloc( btree->blk_handle,
                                                            &new_bid );
                if (jj + 1 < exp_height) {
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     0x0, jj + 1, NULL );
                } else {
                    // Root node, should set the flags.
                    cur_node[jj] = _btree_init_node( btree, new_bid, new_addr,
                                                     btree->root_flag, jj + 1,
                                                     meta );
                    btree->root_bid = new_bid;
                }
                node_bids[jj] = new_bid;
            }

            if (jj == 0) {
                // Leaf node: {key, value}
                void* key_to_insert = nullptr;
                void* val_to_insert = nullptr;
                next_kv(&key_to_insert, &val_to_insert, aux);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       key_to_insert, val_to_insert );
            } else {
                // Non-leaf node: {key, BID of child}
                bid_t enc_bid = _endian_encode(node_bids[jj - 1]);
                btree->kv_ops->set_kv( cur_node[jj], cur_node[jj]->nentry,
                                       k_in_child, &enc_bid );
            }

            cur_node[jj]->nentry++;
            if (cur_node[jj]->nentry == 1) {
                // Need to put the first entry to the parent node.
                btree->kv_ops->get_kv(cur_node[jj], 0, k_in_child, NULL);
            } else {
                if (cur_node[jj]->nentry >= max_num_entries_non_root) {
                    // Otherwise: full, should allocate a new one.
                    write_done(btree->blk_handle, node_bids[jj], aux);
                    cur_node[jj] = NULL;
                    node_bids[jj] = 0;
                }
                break;
            }
        }
    }

    return BTREE_RESULT_SUCCESS;
}